

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.h
# Opt level: O3

bool __thiscall google::protobuf::FieldDescriptor::is_packed(FieldDescriptor *this)

{
  long lVar1;
  undefined1 uVar2;
  
  if (*(int *)(this + 0x4c) != 3) {
    return false;
  }
  if (*(GoogleOnceDynamic **)(this + 0x40) != (GoogleOnceDynamic *)0x0) {
    GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
              (*(GoogleOnceDynamic **)(this + 0x40),TypeOnceInit,this);
  }
  if (*(int *)(this + 0x48) - 0xdU < 0xfffffffc) {
    lVar1 = *(long *)(this + 0x80);
    if (*(int *)(*(long *)(this + 0x30) + 0x8c) == 2) {
      if (lVar1 == 0) goto LAB_002dc928;
    }
    else {
      if (lVar1 == 0) {
        return true;
      }
      if ((*(byte *)(lVar1 + 0x48) & 2) == 0) {
        return true;
      }
    }
    uVar2 = *(undefined1 *)(lVar1 + 0x6c);
  }
  else {
LAB_002dc928:
    uVar2 = 0;
  }
  return (bool)uVar2;
}

Assistant:

inline bool FieldDescriptor::is_repeated() const {
  return label() == LABEL_REPEATED;
}